

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arxmlStorage.cpp
# Opt level: O3

ShortnameElement * __thiscall
lsp::ArxmlStorage::getLastShortnameByOffset(ArxmlStorage *this,uint32_t *offset,uint32_t fileIndex)

{
  long lVar1;
  bool bVar2;
  iterator iVar3;
  undefined8 *puVar4;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
  *poVar5;
  type local_20;
  
  local_20.tail.head = *offset;
  local_20.head = fileIndex;
  iVar3 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::composite_key<lsp::ShortnameElement,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::fileIndex>,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::charOffset>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,std::less<boost::multi_index::composite_key_result<boost::multi_index::composite_key<lsp::ShortnameElement,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::fileIndex>,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::charOffset>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>>,boost::multi_index::deta...>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::
          upper_bound<boost::tuples::tuple<unsigned_int,unsigned_int,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                    ((ordered_index_impl<boost::multi_index::composite_key<lsp::ShortnameElement,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::fileIndex>,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::charOffset>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,std::less<boost::multi_index::composite_key_result<boost::multi_index::composite_key<lsp::ShortnameElement,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::fileIndex>,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::charOffset>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>>,boost::multi_index::deta___>_0>_boost__multi_index__detail__ordered_unique_tag_boost__multi_index__detail__null_augment_policy>
                      *)this->shortnamesOffsetIndex_,
                     (tuple<unsigned_int,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
                      *)&local_20);
  lVar1 = *(long *)(*(long *)(this->shortnamesOffsetIndex_ + -2) + 0x88);
  poVar5 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
            *)(lVar1 + -0x80);
  if (lVar1 == 0) {
    poVar5 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
              *)0x0;
  }
  if (iVar3.node != poVar5) {
    do {
      local_20 = (type)&(iVar3.node)->
                        super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
      ;
      boost::multi_index::detail::
      ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
      ::decrement((pointer *)&local_20);
      iVar3.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
                    *)((long)local_20 + -0x80);
      poVar5 = iVar3.node;
      if (local_20 == (type)0x0) {
        poVar5 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
                  *)0x0;
      }
      if (*(uint32_t *)
           ((long)&(poVar5->
                   super_index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>
                   ).super_pod_value_holder<lsp::ShortnameElement>.space.data_ + 0x44) == fileIndex)
      {
        return (ShortnameElement *)poVar5;
      }
      lVar1 = *(long *)(*(long *)(this->shortnamesOffsetIndex_ + -2) + 0x88);
      bVar2 = local_20 == (type)0x0;
      if (lVar1 != 0) {
        bVar2 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
                 *)(lVar1 + -0x80) == poVar5;
      }
    } while (!bVar2);
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = &PTR__exception_00173fb0;
  __cxa_throw(puVar4,&elementNotFoundException::typeinfo,std::exception::~exception);
}

Assistant:

const lsp::ShortnameElement &lsp::ArxmlStorage::getLastShortnameByOffset(const uint32_t &offset, const uint32_t fileIndex) const
{
    //Get the element with that has a higher offset that we look for
    auto res = shortnamesOffsetIndex_.upper_bound(boost::make_tuple(fileIndex, offset));
    //First element is already higher than we look for -> not found
    if(res == shortnamesOffsetIndex_.begin())
    {
        throw lsp::elementNotFoundException();
    }
    //Now we can look for the first previous element that matches the fileindex
    while((*(--res)).fileIndex != fileIndex)
    {
        if(res == shortnamesOffsetIndex_.begin())
            throw lsp::elementNotFoundException();
    }
    return *res;
}